

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtStretch6(word *pInOut,int nVarS,int nVarB)

{
  int iVar1;
  int iVar2;
  int nWords;
  int step;
  int i;
  int w;
  int nVarB_local;
  int nVarS_local;
  word *pInOut_local;
  
  if (nVarS != nVarB) {
    if (nVarB <= nVarS) {
      __assert_fail("nVarS < nVarB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                    ,0x47d,"void Abc_TtStretch6(word *, int, int)");
    }
    iVar1 = Abc_Truth6WordNum(nVarS);
    iVar2 = Abc_Truth6WordNum(nVarB);
    if (iVar1 != iVar2) {
      if (iVar2 <= iVar1) {
        __assert_fail("step < nWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                      ,0x482,"void Abc_TtStretch6(word *, int, int)");
      }
      for (step = 0; step < iVar2; step = iVar1 + step) {
        for (nWords = 0; nWords < iVar1; nWords = nWords + 1) {
          pInOut[step + nWords] = pInOut[nWords];
        }
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtStretch6( word * pInOut, int nVarS, int nVarB )
{
    int w, i, step, nWords;
    if ( nVarS == nVarB )
        return;
    assert( nVarS < nVarB );
    step = Abc_Truth6WordNum(nVarS);
    nWords = Abc_Truth6WordNum(nVarB);
    if ( step == nWords )
        return;
    assert( step < nWords );
    for ( w = 0; w < nWords; w += step )
        for ( i = 0; i < step; i++ )
            pInOut[w + i] = pInOut[i];              
}